

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O0

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::medianDownscaleImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,int factor)

{
  bool bVar1;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __middle;
  int iVar2;
  int *piVar3;
  long lVar4;
  reference pvVar5;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RDI;
  int ii;
  int kk;
  int n;
  long i;
  long k;
  int d;
  vector<unsigned_short,_std::allocator<unsigned_short>_> v;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *ret;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffeb8;
  long in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  store_t_conflict1 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_fffffffffffffee0;
  int local_6c;
  int local_68;
  int local_64;
  long local_60;
  long local_58;
  int local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_38;
  byte local_19;
  int local_18;
  int local_14;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_10;
  
  local_18 = 1;
  local_10 = in_RSI;
  piVar3 = std::max<int>(&local_18,&local_14);
  local_14 = *piVar3;
  local_19 = 0;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
            ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
             in_stack_fffffffffffffed0._M_current,
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),in_stack_fffffffffffffec0
             ,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x15ccfd);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             in_stack_fffffffffffffee0._M_current,
             CONCAT17(in_stack_fffffffffffffedf,
                      CONCAT16(in_stack_fffffffffffffede,
                               CONCAT24(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))),
             in_stack_fffffffffffffed0._M_current,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x15cd31);
  for (local_50 = 0;
      iVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10),
      local_50 < iVar2; local_50 = local_50 + 1) {
    for (local_58 = 0;
        lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10),
        local_58 < lVar4; local_58 = local_14 + local_58) {
      for (local_60 = 0;
          lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10),
          local_60 < lVar4; local_60 = local_14 + local_60) {
        local_64 = 0;
        local_68 = 0;
        while( true ) {
          bVar1 = false;
          if (local_68 < local_14) {
            lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10)
            ;
            bVar1 = local_58 + local_68 < lVar4;
          }
          if (!bVar1) break;
          local_6c = 0;
          while( true ) {
            bVar1 = false;
            if (local_6c < local_14) {
              in_stack_fffffffffffffee0._M_current = (unsigned_short *)(local_60 + local_6c);
              lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                (local_10);
              bVar1 = (long)in_stack_fffffffffffffee0._M_current < lVar4;
            }
            if (!bVar1) break;
            in_stack_fffffffffffffedf =
                 Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::isValid
                           ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                            CONCAT17(in_stack_fffffffffffffedf,
                                     CONCAT16(in_stack_fffffffffffffede,
                                              CONCAT24(in_stack_fffffffffffffedc,
                                                       in_stack_fffffffffffffed8))),
                            (long)in_stack_fffffffffffffed0._M_current,
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            if ((bool)in_stack_fffffffffffffedf) {
              in_stack_fffffffffffffedc =
                   Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                             (local_10,local_60 + local_6c,local_58 + local_68,local_50);
              pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                 (&local_38,(long)local_64);
              *pvVar5 = in_stack_fffffffffffffedc;
              local_64 = local_64 + 1;
            }
            local_6c = local_6c + 1;
          }
          local_68 = local_68 + 1;
        }
        Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setInvalid
                  ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                   in_stack_fffffffffffffed0._M_current,
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec0,(long)in_stack_fffffffffffffeb8);
        if (0 < local_64) {
          in_stack_fffffffffffffed0._M_current = (unsigned_short *)&local_38;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                    (in_stack_fffffffffffffeb8);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                    (in_stack_fffffffffffffeb8);
          __gnu_cxx::
          __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          ::operator+((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                       *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec0);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                    (in_stack_fffffffffffffeb8);
          __gnu_cxx::
          __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          ::operator+((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                       *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec0);
          __middle._M_current._4_2_ = in_stack_fffffffffffffedc;
          __middle._M_current._0_4_ = in_stack_fffffffffffffed8;
          __middle._M_current._6_1_ = in_stack_fffffffffffffede;
          __middle._M_current._7_1_ = in_stack_fffffffffffffedf;
          std::
          partial_sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                    (in_stack_fffffffffffffee0,__middle,in_stack_fffffffffffffed0);
          in_stack_fffffffffffffeb8 =
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               (local_60 / (long)local_14);
          in_stack_fffffffffffffec0 = local_58 / (long)local_14;
          in_stack_fffffffffffffecc = local_50;
          pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (&local_38,(long)(local_64 >> 1));
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                    (in_RDI,(long)in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffecc,*pvVar5);
        }
      }
    }
  }
  local_19 = 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             in_stack_fffffffffffffed0._M_current);
  if ((local_19 & 1) == 0) {
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image
              ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
               in_stack_fffffffffffffed0._M_current);
  }
  return in_RDI;
}

Assistant:

Image<T> medianDownscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  std::vector<T> v(factor*factor, 0);

  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k+=factor)
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        int n=0;

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValid(i+ii, k+kk))
            {
              v[n]=image.get(i+ii, k+kk, d);
              n++;
            }
          }
        }

        ret.setInvalid(i/factor, k/factor, d);

        if (n > 0)
        {
          partial_sort(v.begin(), v.begin()+(n>>1), v.begin()+n);
          ret.set(i/factor, k/factor, d, v[n>>1]);
        }
      }
    }
  }

  return ret;
}